

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::CallTouch(AActor *this,AActor *toucher)

{
  VMFunction *func;
  PNativeStruct *pPVar1;
  int iVar2;
  DObject *p;
  PFunction *pPVar3;
  PClass *pPVar4;
  FString *this_00;
  long lVar5;
  undefined8 *in_FS_OFFSET;
  VMValue params [2];
  anon_union_16_5_cf148060_for_VMValue_0 local_38;
  FString local_28;
  undefined4 local_20;
  char local_1c [4];
  undefined4 extraout_var;
  
  if (CallTouch::VIndex == 0xffffffff) {
    pPVar1 = &(RegistrationInfo.MyClass)->super_PNativeStruct;
    iVar2 = FName::NameManager::FindName(&FName::NameData,"Touch",false);
    local_38.i = iVar2;
    p = (DObject *)
        PSymbolTable::FindSymbol
                  (&(pPVar1->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.Symbols
                   ,(FName *)&local_38.field_1,false);
    pPVar3 = dyn_cast<PFunction>(p);
    if (pPVar3 == (PFunction *)0x0) {
      __assert_fail("sym != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/virtual.h"
                    ,5,"unsigned int GetVirtualIndex(PClass *, const char *)");
    }
    CallTouch::VIndex = ((pPVar3->Variants).Array)->Implementation->VirtualIndex;
    if (CallTouch::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x5db,"void AActor::CallTouch(AActor *)");
    }
  }
  pPVar4 = (this->super_DThinker).super_DObject.Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
    (this->super_DThinker).super_DObject.Class = pPVar4;
  }
  if ((CallTouch::VIndex < (pPVar4->Virtuals).Count) &&
     (func = (pPVar4->Virtuals).Array[CallTouch::VIndex], func != (VMFunction *)0x0)) {
    local_38.field_1.atag = 1;
    local_38.field_3.Type = '\x03';
    local_20 = 1;
    local_1c[0] = 3;
    local_38.field_1.a = this;
    local_28.Chars = (char *)toucher;
    GlobalVMStack::__tls_init();
    VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,func,(VMValue *)&local_38.field_1,2,
                       (VMReturn *)0x0,0,(VMException **)0x0);
    lVar5 = -0x20;
    this_00 = &local_28;
    do {
      if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
        FString::~FString(this_00);
      }
      this_00 = this_00 + -2;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0);
  }
  else {
    (*(this->super_DThinker).super_DObject._vptr_DObject[0x13])(this,toucher);
  }
  return;
}

Assistant:

void AActor::CallTouch(AActor *toucher)
{
	IFVIRTUAL(AActor, Touch)
	{
		VMValue params[2] = { (DObject*)this, toucher };
		GlobalVMStack.Call(func, params, 2, nullptr, 0, nullptr);
	}
	else Touch(toucher);
}